

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3813::ComputeInternalForces(ChElementHexaANCF_3813 *this)

{
  ChVectorDynamic<> *in_RSI;
  
  ComputeInternalForces((ChElementHexaANCF_3813 *)&this[-1].field_0x4a78,in_RSI);
  return;
}

Assistant:

void ChElementHexaANCF_3813::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    int ie = GetElemNum();

    ChVector<> pA = m_nodes[0]->GetPos();
    ChVector<> pB = m_nodes[1]->GetPos();
    ChVector<> pC = m_nodes[2]->GetPos();
    ChVector<> pD = m_nodes[3]->GetPos();
    ChVector<> pE = m_nodes[4]->GetPos();
    ChVector<> pF = m_nodes[5]->GetPos();
    ChVector<> pG = m_nodes[6]->GetPos();
    ChVector<> pH = m_nodes[7]->GetPos();

    ChMatrixNM<double, 8, 3> d;
    d(0, 0) = pA.x();
    d(0, 1) = pA.y();
    d(0, 2) = pA.z();
    d(1, 0) = pB.x();
    d(1, 1) = pB.y();
    d(1, 2) = pB.z();
    d(2, 0) = pC.x();
    d(2, 1) = pC.y();
    d(2, 2) = pC.z();
    d(3, 0) = pD.x();
    d(3, 1) = pD.y();
    d(3, 2) = pD.z();
    d(4, 0) = pE.x();
    d(4, 1) = pE.y();
    d(4, 2) = pE.z();
    d(5, 0) = pF.x();
    d(5, 1) = pF.y();
    d(5, 2) = pF.z();
    d(6, 0) = pG.x();
    d(6, 1) = pG.y();
    d(6, 2) = pG.z();
    d(7, 0) = pH.x();
    d(7, 1) = pH.y();
    d(7, 2) = pH.z();

    double v = m_Material->Get_v();
    double E = m_Material->Get_E();

    Fi.setZero();

    /// If numerical differentiation is used, only the internal force and EAS stiffness
    /// will be calculated. If the numerical differentiation is not used, the jacobian
    /// will also be calculated.
    bool use_numerical_differentiation = false;

    /// Internal force and EAS parameters are calculated for numerical differentiation.
    if (use_numerical_differentiation) {
        //////////////////////////////////////////////////////////////////////////////////////////////////////////
        ChVectorN<double, 330> TempIntegratedResult;
        ChVectorN<double, 24> Finternal;

        ChMatrixNM<double, 6, 6> T0;
        ChVectorN<double, 9> HE;
        ChMatrixNM<double, 9, 24> GDEPSP;
        ChMatrixNM<double, 9, 9> KALPHA;
        ChMatrixNM<double, 9, 9> KALPHA1;
        ChVectorN<double, 9> ResidHE;
        double detJ0C;
        ChVectorN<double, 9> alpha_eas;
        ChVectorN<double, 9> renewed_alpha_eas;
        ChVectorN<double, 9> previous_alpha;

        previous_alpha = m_stock_alpha_EAS;
        alpha_eas = previous_alpha;
        ResidHE.setZero();
        int count = 0;
        int fail = 1;
        /// Begin EAS loop
        while (fail == 1) {
            /// Update alpha EAS
            alpha_eas = alpha_eas - ResidHE;
            renewed_alpha_eas = alpha_eas;

            Finternal.setZero();
            HE.setZero();
            GDEPSP.setZero();
            KALPHA.setZero();

            // Enhanced Assumed Strain (EAS)
            T0.setZero();
            detJ0C = 0.0;
            T0DetJElementCenterForEAS(m_d0, T0, detJ0C);
            //== F_internal ==//
            // Choose constructors depending on m_isMooney
            Brick_ForceNumerical myformula =
                !m_isMooney ? Brick_ForceNumerical(&d, &m_d0, this, &T0, &detJ0C, &alpha_eas, &E, &v)
                            : Brick_ForceNumerical(&d, &m_d0, this, &T0, &detJ0C, &alpha_eas);
            TempIntegratedResult.setZero();
            ChQuadrature::Integrate3D<ChVectorN<double, 330>>(
                TempIntegratedResult,  // result of integration will go there
                myformula,             // formula to integrate
                -1,                    // start of x
                1,                     // end of x
                -1,                    // start of y
                1,                     // end of y
                -1,                    // start of z
                1,                     // end of z
                2                      // order of integration
            );

            ///===============================================================//
            ///===TempIntegratedResult(0:23,1) -> InternalForce(24x1)=========//
            ///===TempIntegratedResult(24:32,1) -> HE(9x1)   brick   =========//
            ///===TempIntegratedResult(33:248,1) -> GDEPSP(9x24)     =========//
            ///===TempIntegratedResult(249:329,1) -> KALPHA(9x9)     =========//
            ///===============================================================//
            ChVectorN<double, 216> GDEPSPvec;
            ChVectorN<double, 81> KALPHAvec;
            Finternal = TempIntegratedResult.segment(0, 24);
            HE = TempIntegratedResult.segment(24, 9);
            GDEPSPvec = TempIntegratedResult.segment(33, 216);
            KALPHAvec = TempIntegratedResult.segment(249, 81);
            GDEPSP = Eigen::Map<ChMatrixNM<double, 9, 24>>(GDEPSPvec.data(), 9, 24);
            KALPHA = Eigen::Map<ChMatrixNM<double, 9, 9>>(KALPHAvec.data(), 9, 9);
            KALPHA1 = KALPHA;

            if (m_flag_HE == NUMERICAL)
                break;  // When numerical jacobian loop, no need to calculate HE
            count = count + 1;
            double norm_HE = HE.norm();

            if (norm_HE < 0.00001) {
                fail = 0;
            } else {
                // Solve for ResidHE
                ResidHE = KALPHA1.colPivHouseholderQr().solve(HE);
            }
            if (m_flag_HE == ANALYTICAL && count > 2) {
                GetLog() << ie << "  count " << count << "  NormHE " << norm_HE << "\n";
            }
        }
        Fi = -Finternal;
        //== Stock_Alpha=================//
        if (m_flag_HE == ANALYTICAL) {
            SetStockAlpha(renewed_alpha_eas(0), renewed_alpha_eas(1), renewed_alpha_eas(2), renewed_alpha_eas(3),
                          renewed_alpha_eas(4), renewed_alpha_eas(5), renewed_alpha_eas(6), renewed_alpha_eas(7),
                          renewed_alpha_eas(8));  // this->
        }
        //== Jacobian Matrix for alpha ==//
        if (m_flag_HE == ANALYTICAL) {
            ChMatrixNM<double, 9, 9> INV_KALPHA;
            ChMatrixNM<double, 24, 24> stock_jac_EAS_elem;

            for (int ii = 0; ii < 9; ii++) {
                ChVectorN<double, 9> DAMMY_vec;
                DAMMY_vec.setZero();
                DAMMY_vec(ii) = 1.0;
                INV_KALPHA.col(ii) = KALPHA.colPivHouseholderQr().solve(DAMMY_vec);
            }
            stock_jac_EAS_elem = GDEPSP.transpose() * INV_KALPHA * GDEPSP;
            m_stock_jac_EAS = stock_jac_EAS_elem;
        }
    } else {
        ////////////////////////////////////////////////////////////////////////////////////////////////////////////

        ChVectorN<double, 906> TempIntegratedResult;
        ChVectorN<double, 24> Finternal;
        // Enhanced Assumed Strain (EAS)
        ChMatrixNM<double, 6, 6> T0;
        ChVectorN<double, 9> HE;
        ChMatrixNM<double, 9, 24> GDEPSP;
        ChMatrixNM<double, 9, 9> KALPHA;
        ChMatrixNM<double, 24, 24> KTE;
        ChMatrixNM<double, 9, 9> KALPHA1;
        ChVectorN<double, 9> ResidHE;
        double detJ0C;
        ChVectorN<double, 9> alpha_eas;
        ChVectorN<double, 9> renewed_alpha_eas;
        ChVectorN<double, 9> previous_alpha;

        previous_alpha = m_stock_alpha_EAS;
        alpha_eas = previous_alpha;
        ResidHE.setZero();
        int count = 0;
        int fail = 1;
        // Loop to obtain convergence in EAS internal parameters alpha
        // This loops call ChQuadrature::Integrate3D on MyAnalyticalForce,
        // which calculates the Jacobian at every iteration of each time step
        int iteralpha = 0;  //  Counts number of iterations
        while (fail == 1) {
            iteralpha++;
            alpha_eas = alpha_eas - ResidHE;
            renewed_alpha_eas = alpha_eas;

            Finternal.setZero();  // Internal force vector
            HE.setZero();         // Internal force vector from EAS
            GDEPSP.setZero();     // Jacobian of EAS forces w.r.t. coordinates
            KALPHA.setZero();     // Jacobian of EAS forces w.r.t. EAS internal parameters

            // Enhanced Assumed Strain (EAS)
            T0.setZero();
            detJ0C = 0.0;
            T0DetJElementCenterForEAS(m_d0, T0, detJ0C);

            //== F_internal ==//
            Brick_ForceAnalytical myformula =
                !m_isMooney ? Brick_ForceAnalytical(&d, &m_d0, this, &T0, &detJ0C, &alpha_eas, &E, &v)
                            : Brick_ForceAnalytical(&d, &m_d0, this, &T0, &detJ0C, &alpha_eas);
            TempIntegratedResult.setZero();
            ChQuadrature::Integrate3D<ChVectorN<double, 906>>(
                TempIntegratedResult,  // result of integration will go there
                myformula,             // formula to integrate
                -1,                    // start of x
                1,                     // end of x
                -1,                    // start of y
                1,                     // end of y
                -1,                    // start of z
                1,                     // end of z
                2                      // order of integration
            );

            //	///===============================================================//
            //	///===TempIntegratedResult(0:23,1) -> InternalForce(24x1)=========//
            //	///===TempIntegratedResult(24:28,1) -> HE(5x1)           =========//
            //	///===TempIntegratedResult(29:148,1) -> GDEPSP(5x24)     =========//
            //	///===TempIntegratedResult(149:173,1) -> KALPHA(5x5)     =========//
            //	///===TempIntegratedResult(174:749,1) -> Stiffness Matrix(24x24) =//
            //	///===============================================================//
            ChVectorN<double, 216> GDEPSPvec;
            ChVectorN<double, 81> KALPHAvec;
            ChVectorN<double, 576> JACvec;
            Finternal = TempIntegratedResult.segment(0, 24);
            HE = TempIntegratedResult.segment(24, 9);
            GDEPSPvec = TempIntegratedResult.segment(33, 216);
            KALPHAvec = TempIntegratedResult.segment(249, 81);
            JACvec = TempIntegratedResult.segment(330, 576);
            for (int i = 0; i < 9; i++) {
                for (int j = 0; j < 24; j++) {
                    GDEPSP(i, j) = GDEPSPvec(i * 24 + j);
                }
            }
            // GDEPSP = GDEPSPvec;
            for (int i = 0; i < 9; i++) {
                for (int j = 0; j < 9; j++) {
                    KALPHA(i, j) = KALPHAvec(i * 9 + j);
                }
            }
            // KALPHA = KALPHAvec;
            for (int i = 0; i < 24; i++) {
                for (int j = 0; j < 24; j++) {
                    KTE(i, j) = JACvec(i * 24 + j);
                }
            }
            // KTE = JACvec;

            // Calculation of the element Jacobian for implicit integrator
            // KTE and stock_jac_EAS_elem.
            KALPHA1 = KALPHA;
            if (m_flag_HE == NUMERICAL)
                break;  // When numerical jacobian loop, no need to calculate HE
            count = count + 1;
            double norm_HE = HE.norm();
            if (norm_HE < 0.00001) {
                fail = 0;
            } else {
                // Solve for ResidHE
                ResidHE = KALPHA1.colPivHouseholderQr().solve(HE);
            }
        }  // end of while
        Fi = -Finternal;
        ////== Stock_Alpha=================//
        if (m_flag_HE == ANALYTICAL) {
            SetStockAlpha(renewed_alpha_eas(0), renewed_alpha_eas(1), renewed_alpha_eas(2), renewed_alpha_eas(3),
                          renewed_alpha_eas(4), renewed_alpha_eas(5), renewed_alpha_eas(6), renewed_alpha_eas(7),
                          renewed_alpha_eas(8));  // this->
        }
        ////== Jacobian Matrix for alpha ==//
        if (m_flag_HE == ANALYTICAL) {
            ChMatrixNM<double, 9, 9> INV_KALPHA;
            ChMatrixNM<double, 24, 24> stock_jac_EAS_elem;

            for (int ii = 0; ii < 9; ii++) {
                ChVectorN<double, 9> DAMMY_vec;
                DAMMY_vec.setZero();
                DAMMY_vec(ii) = 1.0;
                INV_KALPHA.col(ii) = KALPHA.colPivHouseholderQr().solve(DAMMY_vec);
            }
            stock_jac_EAS_elem = GDEPSP.transpose() * INV_KALPHA * GDEPSP;
            m_stock_KTE = KTE;
            m_stock_jac_EAS = stock_jac_EAS_elem;
        }
    }  // end of else for numerical or analytical
}